

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

FuncInfo *
PreVisitFunction(ParseNodeFnc *pnodeFnc,ByteCodeGenerator *byteCodeGenerator,
                ParseableFunctionInfo *reuseNestedFunc)

{
  undefined1 *puVar1;
  Type *pTVar2;
  byte bVar3;
  ushort uVar4;
  FncFlags FVar5;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *this;
  IdentPtr pIVar6;
  code *pcVar7;
  bool bVar8;
  bool bVar9;
  Type *ppFVar10;
  ParseNodeFnc *pPVar11;
  size_t sVar12;
  undefined4 *puVar13;
  ParseNodeVar *pPVar14;
  FuncInfo *func;
  FunctionBody *pFVar15;
  ParseNode *this_00;
  ArgSlot AVar16;
  PerfHints hint;
  uint32 nameLength;
  uint32 shortNameOffset;
  byte bVar17;
  Type this_01;
  char16 *string;
  bool local_31 [8];
  bool funcExprWithName;
  
  this = byteCodeGenerator->funcInfoStack;
  if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next == this) {
    this_01 = (FuncInfo *)0x0;
  }
  else {
    ppFVar10 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                         (&this->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
    this_01 = *ppFVar10;
  }
  shortNameOffset = 0;
  bVar8 = false;
  if ((byteCodeGenerator->flags & 0x1000) == 0) {
    bVar8 = FuncInfo::IsGlobalFunction(this_01);
    if (bVar8) {
      pPVar11 = (ParseNodeFnc *)ParseNodeFnc::GetParamScope(this_01->root);
      bVar8 = pPVar11 == pnodeFnc;
    }
    else {
      bVar8 = false;
    }
  }
  local_31[0] = false;
  string = pnodeFnc->hint;
  if (string == (char16_t *)0x0) {
    string = L"Anonymous function";
    nameLength = 0x12;
  }
  else {
    nameLength = pnodeFnc->hintLength;
    shortNameOffset = pnodeFnc->hintOffset;
    if (nameLength == 0) {
      sVar12 = PAL_wcslen(string);
      nameLength = 0;
      if ((int)sVar12 != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x9b3,
                           "(funcNameLength != 0 || funcNameLength == (int)PAL_wcslen(funcName))",
                           "funcNameLength != 0 || funcNameLength == (int)wcslen(funcName)");
        if (!bVar9) goto LAB_00827811;
        *puVar13 = 0;
      }
    }
  }
  FVar5 = pnodeFnc->fncFlags;
  if ((FVar5 & (kFunctionIsMethod|kFunctionDeclaration)) == kFunctionNone) {
    pPVar14 = pnodeFnc->pnodeName;
    if (pPVar14 == (ParseNodeVar *)0x0) {
      if ((FVar5 >> 10 & 1) == 0) goto LAB_0082744e;
      string = L"Module code";
      nameLength = 0xb;
    }
    else {
      if ((pPVar14->super_ParseNode).nop != knopVarDecl) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x9c1,"(pnodeFnc->pnodeName->nop == knopVarDecl)",
                           "pnodeFnc->pnodeName->nop == knopVarDecl");
        if (!bVar9) goto LAB_00827811;
        *puVar13 = 0;
        pPVar14 = pnodeFnc->pnodeName;
      }
      nameLength = pPVar14->pid->m_cch;
      string = (char16 *)&pPVar14->pid->field_0x22;
      local_31[0] = true;
    }
    shortNameOffset = 0;
  }
  else {
    pIVar6 = pnodeFnc->pid;
    if ((FVar5 >> 0x14 & 1) == 0 && pIVar6 != (IdentPtr)0x0) {
      nameLength = pIVar6->m_cch;
      string = (char16 *)&pIVar6->field_0x22;
      shortNameOffset = 0;
    }
  }
LAB_0082744e:
  bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,ByteCodePhase);
  if (bVar9) {
    Output::Print(L"function start %s\n",string);
  }
  if (pnodeFnc->funcInfo != (FuncInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x9d6,"(pnodeFnc->funcInfo == nullptr)","pnodeFnc->funcInfo == nullptr");
    if (!bVar9) {
LAB_00827811:
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    *puVar13 = 0;
  }
  func = ByteCodeGenerator::StartBindFunction
                   (byteCodeGenerator,string,nameLength,shortNameOffset,local_31,pnodeFnc,
                    reuseNestedFunc);
  pnodeFnc->funcInfo = func;
  *(ushort *)&(func->byteCodeFunction->super_FunctionProxy).field_0x45 =
       *(ushort *)&(func->byteCodeFunction->super_FunctionProxy).field_0x45 & 0xffdf |
       (ushort)local_31[0] << 5;
  *(ushort *)&(func->byteCodeFunction->super_FunctionProxy).field_0x45 =
       *(ushort *)&(func->byteCodeFunction->super_FunctionProxy).field_0x45 & 0xffbf |
       (ushort)pnodeFnc->isNameIdentifierRef << 6;
  if (bVar8) {
    ByteCodeGenerator::SetRootFuncInfo(byteCodeGenerator,func);
  }
  if (pnodeFnc->pnodeBody == (ParseNodePtr)0x0) {
    this_00 = pnodeFnc->pnodeParams;
    AVar16 = 1;
    while( true ) {
      if (this_00 == (ParseNode *)0x0) {
        ppFVar10 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                             (&byteCodeGenerator->funcInfoStack->
                               super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
        (*ppFVar10)->inArgsCount = AVar16;
        return func;
      }
      if (AVar16 == 0xffff) break;
      this_00 = ParseNode::GetFormalNext(this_00);
      AVar16 = AVar16 + 1;
    }
    Math::DefaultOverflowPolicy();
  }
  FVar5 = pnodeFnc->fncFlags;
  if ((FVar5 & kFunctionHasReferenceableBuiltInArguments) == kFunctionNone) goto LAB_008276fd;
  if ((FVar5 & kFunctionCallsEval) == kFunctionNone) {
    if ((FVar5 & kFunctionUsesArguments) == kFunctionNone) goto LAB_008276fd;
    func->field_0xb4 = func->field_0xb4 | 8;
    pFVar15 = FuncInfo::GetParsedFunctionBody(func);
    uVar4 = *(ushort *)&(pFVar15->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45;
    if (-1 < (short)uVar4) {
      *(ushort *)&(pFVar15->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 =
           uVar4 | 0x8000;
    }
    if ((int)pnodeFnc->fncFlags < 0) {
      uVar4 = *(ushort *)&(func->byteCodeFunction->super_FunctionProxy).field_0x45;
      bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,PerfHintPhase);
      if (((uVar4 >> 8 & 1) != 0) || (hint = HeapArgumentsDueToWriteToFormals, !bVar8)) {
        if ((uVar4 >> 8 & 1) != 0) goto LAB_008275bf;
        goto LAB_008277bb;
      }
LAB_00827797:
      pFVar15 = FuncInfo::GetParsedFunctionBody(func);
      bVar17 = 0;
      WritePerfHint(hint,pFVar15,0);
    }
    else {
      Js::Phases::IsEnabled((Phases *)&DAT_015b6718,PerfHintPhase);
LAB_008275bf:
      bVar17 = 1;
      if ((1 < pnodeFnc->funcInfo->paramScope->m_count) &&
         (((((byteCodeGenerator->flags & 0x400) != 0 ||
            ((pnodeFnc->fncFlags & kFunctionHasWithStmt) != kFunctionNone)) ||
           (bVar3 = byteCodeGenerator->m_utf8SourceInfo->field_0xa8,
           (byte)((bVar3 >> 5 |
                  (byteCodeGenerator->m_utf8SourceInfo->debugModeSource).ptr != (uchar *)0x0) &
                 (bVar3 & 0x40) >> 6) != 0)) ||
          ((bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,StackArgFormalsOptPhase), bVar8 ||
           (bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,StackArgOptPhase), bVar8)))))) {
        bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,PerfHintPhase);
        if (bVar8) {
          if ((pnodeFnc->fncFlags & kFunctionHasWithStmt) != kFunctionNone) {
            pFVar15 = FuncInfo::GetParsedFunctionBody(func);
            WritePerfHint(HasWithBlock,pFVar15,0);
          }
          hint = SrcIsEval;
          if ((byteCodeGenerator->flags & 0x400) != 0) goto LAB_00827797;
        }
LAB_008277bb:
        bVar17 = 0;
      }
    }
    FVar5 = pnodeFnc->fncFlags;
    *(uint *)&func->field_0xb4 = *(uint *)&func->field_0xb4 | 0x10;
    *(ushort *)&(func->byteCodeFunction->super_FunctionProxy).field_0x45 =
         *(ushort *)&(func->byteCodeFunction->super_FunctionProxy).field_0x45 & 0xdfff |
         (ushort)((FVar5 & (kFunctionIsAsync|kFunctionIsGenerator)) == kFunctionNone & bVar17) <<
         0xd;
    AVar16 = func->inArgsCount;
  }
  else {
    func->field_0xb4 = func->field_0xb4 | 0x18;
    puVar1 = &(func->byteCodeFunction->super_FunctionProxy).field_0x45;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xdfff;
    AVar16 = func->inArgsCount;
  }
  if (AVar16 == 0) {
    ByteCodeGenerator::AssignNullConstRegister(byteCodeGenerator);
  }
LAB_008276fd:
  pFVar15 = FuncInfo::GetParsedFunctionBody(this_01);
  if (((func->field_0xb4 & 8) != 0) ||
     (((pFVar15->super_ParseableFunctionInfo).flags & Flags_HasOrParentHasArguments) != Flags_None))
  {
    pFVar15 = FuncInfo::GetParsedFunctionBody(func);
    pTVar2 = &(pFVar15->super_ParseableFunctionInfo).flags;
    *pTVar2 = *pTVar2 | Flags_HasOrParentHasArguments;
  }
  PreVisitBlock(pnodeFnc->pnodeScopes,byteCodeGenerator);
  bVar8 = ByteCodeGenerator::NeedScopeObjectForArguments(byteCodeGenerator,func,func->root);
  AddArgsToScope(pnodeFnc,byteCodeGenerator,!bVar8);
  return func;
}

Assistant:

FuncInfo* PreVisitFunction(ParseNodeFnc* pnodeFnc, ByteCodeGenerator* byteCodeGenerator, Js::ParseableFunctionInfo *reuseNestedFunc)
{
    // Do binding of function name(s), initialize function scope, propagate function-wide properties from
    // the parent (if any).
    FuncInfo* parentFunc = byteCodeGenerator->TopFuncInfo();

    // fIsRoot indicates that this is the root function to be returned to a ParseProcedureText/AddScriptLet/etc. call.
    // In such cases, the global function is just a wrapper around the root function's declaration.
    // We used to assert that this was the only top-level function body, but it's possible to trick
    // "new Function" into compiling more than one function (see WOOB 1121759).
    bool fIsRoot = (!(byteCodeGenerator->GetFlags() & fscrGlobalCode) &&
        parentFunc->IsGlobalFunction() &&
        parentFunc->root->GetTopLevelScope() == pnodeFnc);

    const char16 *funcName = Js::Constants::AnonymousFunction;
    uint funcNameLength = Js::Constants::AnonymousFunctionLength;
    uint functionNameOffset = 0;
    bool funcExprWithName = false;

    if (pnodeFnc->hint != nullptr)
    {
        funcName = reinterpret_cast<const char16*>(pnodeFnc->hint);
        funcNameLength = pnodeFnc->hintLength;
        functionNameOffset = pnodeFnc->hintOffset;
        Assert(funcNameLength != 0 || funcNameLength == (int)wcslen(funcName));
    }
    if (pnodeFnc->IsDeclaration() || pnodeFnc->IsMethod())
    {
        // Class members have the fully qualified name stored in 'hint', no need to replace it.
        if (pnodeFnc->pid && !pnodeFnc->IsClassMember())
        {
            funcName = reinterpret_cast<const char16*>(pnodeFnc->pid->Psz());
            funcNameLength = pnodeFnc->pid->Cch();
            functionNameOffset = 0;
        }
    }
    else if (pnodeFnc->pnodeName != nullptr)
    {
        Assert(pnodeFnc->pnodeName->nop == knopVarDecl);
        funcName = reinterpret_cast<const char16*>(pnodeFnc->pnodeName->pid->Psz());
        funcNameLength = pnodeFnc->pnodeName->pid->Cch();
        functionNameOffset = 0;
        //
        // create the new scope for Function expression only in ES5 mode
        //
        funcExprWithName = true;
    }
    else if (pnodeFnc->IsModule())
    {
        funcName = Js::Constants::ModuleCode;
        funcNameLength = Js::Constants::ModuleCodeLength;
        functionNameOffset = 0;
    }

    if (byteCodeGenerator->Trace())
    {
        Output::Print(_u("function start %s\n"), funcName);
    }

    Assert(pnodeFnc->funcInfo == nullptr);
    FuncInfo* funcInfo = pnodeFnc->funcInfo = byteCodeGenerator->StartBindFunction(funcName, funcNameLength, functionNameOffset, &funcExprWithName, pnodeFnc, reuseNestedFunc);
    funcInfo->byteCodeFunction->SetIsNamedFunctionExpression(funcExprWithName);
    funcInfo->byteCodeFunction->SetIsNameIdentifierRef(pnodeFnc->isNameIdentifierRef);

    if (fIsRoot)
    {
        byteCodeGenerator->SetRootFuncInfo(funcInfo);
    }

    if (pnodeFnc->pnodeBody == nullptr)
    {
        // This is a deferred byte code gen, so we're done.
        // Process the formal arguments, even if there's no AST for the body, to support Function.length.
        Js::ArgSlot pos = 1;
        // We skip the rest parameter here because it is not counted towards the in arg count.
        MapFormalsWithoutRest(pnodeFnc, [&](ParseNode *pnode) { ArgSlotMath::Inc(pos); });
        byteCodeGenerator->SetNumberOfInArgs(pos);
        return funcInfo;
    }

    if (pnodeFnc->HasReferenceableBuiltInArguments())
    {
        // The parser identified that there is a way to reference the built-in 'arguments' variable from this function. So, we
        // need to determine whether we need to create the variable or not. We need to create the variable iff:
        if (pnodeFnc->CallsEval())
        {
            // 1. eval is called.
            // 2. when the debugging is enabled, since user can seek arguments during breakpoint.
            funcInfo->SetHasArguments(true);
            funcInfo->SetHasHeapArguments(true);
            if (funcInfo->inArgsCount == 0)
            {
                // If no formals to function, no need to create the propertyid array
                byteCodeGenerator->AssignNullConstRegister();
            }
        }
        else if (pnodeFnc->UsesArguments())
        {
            // 3. the function directly references an 'arguments' identifier
            funcInfo->SetHasArguments(true);
            funcInfo->GetParsedFunctionBody()->SetUsesArgumentsObject(true);
            if (pnodeFnc->HasHeapArguments())
            {
                bool doStackArgsOpt = (!pnodeFnc->HasAnyWriteToFormals() || funcInfo->GetIsStrictMode());
#ifdef PERF_HINT
                if (PHASE_TRACE1(Js::PerfHintPhase) && !doStackArgsOpt)
                {
                    WritePerfHint(PerfHints::HeapArgumentsDueToWriteToFormals, funcInfo->GetParsedFunctionBody(), 0);
                }
#endif

                //With statements - need scope object to be present.
                if ((doStackArgsOpt && pnodeFnc->funcInfo->GetParamScope()->Count() > 1) && ((byteCodeGenerator->GetFlags() & fscrEval) ||
                    pnodeFnc->HasWithStmt() || byteCodeGenerator->IsInDebugMode() || PHASE_OFF1(Js::StackArgFormalsOptPhase) || PHASE_OFF1(Js::StackArgOptPhase)))
                {
                    doStackArgsOpt = false;
#ifdef PERF_HINT
                    if (PHASE_TRACE1(Js::PerfHintPhase))
                    {
                        if (pnodeFnc->HasWithStmt())
                        {
                            WritePerfHint(PerfHints::HasWithBlock, funcInfo->GetParsedFunctionBody(), 0);
                        }

                        if(byteCodeGenerator->GetFlags() & fscrEval)
                        {
                            WritePerfHint(PerfHints::SrcIsEval, funcInfo->GetParsedFunctionBody(), 0);
                        }
                    }
#endif
                }
                funcInfo->SetHasHeapArguments(true, !pnodeFnc->IsCoroutine() && doStackArgsOpt /*= Optimize arguments in backend*/);
                if (funcInfo->inArgsCount == 0)
                {
                    // If no formals to function, no need to create the propertyid array
                    byteCodeGenerator->AssignNullConstRegister();
                }
            }
        }
    }

    Js::FunctionBody* parentFunctionBody = parentFunc->GetParsedFunctionBody();
    if (funcInfo->GetHasArguments() ||
        parentFunctionBody->GetHasOrParentHasArguments())
    {
        // The JIT uses this info, for instance, to narrow kills of array operations
        funcInfo->GetParsedFunctionBody()->SetHasOrParentHasArguments(true);
    }
    PreVisitBlock(pnodeFnc->pnodeScopes, byteCodeGenerator);
    // If we have arguments, we are going to need locations if the function is in strict mode or we have a non-simple parameter list. This is because we will not create a scope object.
    bool assignLocationForFormals = !byteCodeGenerator->NeedScopeObjectForArguments(funcInfo, funcInfo->root);
    AddArgsToScope(pnodeFnc, byteCodeGenerator, assignLocationForFormals);

    return funcInfo;
}